

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O3

int32_t __thiscall
icu_63::CollationRuleParser::readWords(CollationRuleParser *this,int32_t i,UnicodeString *raw)

{
  ushort uVar1;
  short sVar2;
  UBool UVar3;
  int8_t iVar4;
  ushort uVar5;
  uint i_00;
  UnicodeString *pUVar6;
  char16_t *pcVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  char16_t cVar12;
  int32_t iVar13;
  UChar local_42;
  UChar *local_40;
  
  uVar1 = (raw->fUnion).fStackFields.fLengthAndFlags;
  uVar5 = 2;
  if ((uVar1 & 1) == 0) {
    uVar5 = uVar1 & 0x1e;
  }
  (raw->fUnion).fStackFields.fLengthAndFlags = uVar5;
  i_00 = skipWhiteSpace(this,i);
  pUVar6 = this->rules;
  sVar2 = (pUVar6->fUnion).fStackFields.fLengthAndFlags;
  uVar8 = (uint)sVar2;
  if (sVar2 < 0) {
    uVar10 = (pUVar6->fUnion).fFields.fLength;
  }
  else {
    uVar10 = (int)uVar8 >> 5;
  }
  if ((int)i_00 < (int)uVar10) {
    do {
      if (i_00 < uVar10) {
        if ((uVar8 & 2) == 0) {
          pcVar7 = (pUVar6->fUnion).fFields.fArray;
        }
        else {
          pcVar7 = (char16_t *)((long)&pUVar6->fUnion + 2);
        }
        cVar12 = pcVar7[(int)i_00];
        uVar8 = (uint)(ushort)cVar12;
        if ((ushort)cVar12 - 0x21 < 0x5e) {
          if (0x2f < (ushort)cVar12) {
            uVar10 = (ushort)cVar12 - 0x3a;
            if (uVar10 < 0x27) {
              if ((ulong)uVar10 == 0x25) goto LAB_0024e069;
              if ((0x5e0000007fU >> ((ulong)uVar10 & 0x3f) & 1) != 0) goto LAB_0024e0e4;
            }
            if ((ushort)cVar12 < 0x7b) goto LAB_0024e069;
          }
          if (cVar12 != L'-') {
LAB_0024e0e4:
            uVar1 = (raw->fUnion).fStackFields.fLengthAndFlags;
            if (uVar1 < 0x20) {
              return i_00;
            }
            if ((short)uVar1 < 0) {
              iVar13 = (raw->fUnion).fFields.fLength;
            }
            else {
              iVar13 = (int)(short)uVar1 >> 5;
            }
            iVar4 = UnicodeString::doCompare
                              (raw,iVar13 + -1,1,
                               L" 㙎捩彵㌶㤱潃汬瑡潩剮汵健牡敳㑲楓歮E㙎捩彵㌶㤱潃汬瑡潩剮汵健牡敳㡲浉潰瑲牥Evariable top"
                               ,0,1);
            local_40 = 
            L" 㙎捩彵㌶㤱潃汬瑡潩剮汵健牡敳㑲楓歮E㙎捩彵㌶㤱潃汬瑡潩剮汵健牡敳㡲浉潰瑲牥Evariable top"
            ;
            if (iVar4 != '\0') {
              return i_00;
            }
            uVar1 = (raw->fUnion).fStackFields.fLengthAndFlags;
            if ((short)uVar1 < 0) {
              iVar11 = (raw->fUnion).fFields.fLength;
            }
            else {
              iVar11 = (int)(short)uVar1 >> 5;
            }
            iVar9 = iVar11 + -1;
            if (iVar9 == 0 && ((int)(short)uVar1 & 1U) != 0) {
              UnicodeString::unBogus(raw);
              return i_00;
            }
            if (iVar11 == 0) {
              return i_00;
            }
            if (iVar11 < 0x401) {
              (raw->fUnion).fStackFields.fLengthAndFlags = (short)iVar9 * 0x20 | uVar1 & 0x1f;
              return i_00;
            }
            (raw->fUnion).fStackFields.fLengthAndFlags = uVar1 | 0xffe0;
            (raw->fUnion).fFields.fLength = iVar9;
            return i_00;
          }
          uVar8 = 0x2d;
          cVar12 = L'-';
        }
      }
      else {
        uVar8 = 0xffff;
        cVar12 = L'\xffff';
      }
LAB_0024e069:
      UVar3 = PatternProps::isWhiteSpace(uVar8);
      i_00 = i_00 + 1;
      if (UVar3 == '\0') {
        local_42 = cVar12;
        UnicodeString::doAppend(raw,&local_42,0,1);
      }
      else {
        local_42 = L' ';
        UnicodeString::doAppend(raw,&local_42,0,1);
        i_00 = skipWhiteSpace(this,i_00);
      }
      pUVar6 = this->rules;
      sVar2 = (pUVar6->fUnion).fStackFields.fLengthAndFlags;
      uVar8 = (uint)sVar2;
      if (sVar2 < 0) {
        uVar10 = (pUVar6->fUnion).fFields.fLength;
      }
      else {
        uVar10 = (int)uVar8 >> 5;
      }
    } while ((int)i_00 < (int)uVar10);
  }
  return 0;
}

Assistant:

int32_t
CollationRuleParser::readWords(int32_t i, UnicodeString &raw) const {
    static const UChar sp = 0x20;
    raw.remove();
    i = skipWhiteSpace(i);
    for(;;) {
        if(i >= rules->length()) { return 0; }
        UChar c = rules->charAt(i);
        if(isSyntaxChar(c) && c != 0x2d && c != 0x5f) {  // syntax except -_
            if(raw.isEmpty()) { return i; }
            if(raw.endsWith(&sp, 1)) {  // remove trailing space
                raw.truncate(raw.length() - 1);
            }
            return i;
        }
        if(PatternProps::isWhiteSpace(c)) {
            raw.append(sp);
            i = skipWhiteSpace(i + 1);
        } else {
            raw.append(c);
            ++i;
        }
    }
}